

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
* __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::find(basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
       *__return_storage_ptr__,
      arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      *this,basic_string_view<char> name)

{
  longlong *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  entry *peVar4;
  ulong uVar5;
  longlong lVar6;
  size_t sVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  ulong __n;
  long lVar11;
  bool bVar12;
  bool bVar13;
  
  uVar10 = name.size_;
  uVar3 = this->size_;
  bVar12 = (ulong)uVar3 == 0;
  if (!bVar12) {
    peVar4 = this->map_;
    lVar11 = 0;
    do {
      uVar5 = *(ulong *)((long)&(peVar4->name).size_ + lVar11);
      __n = uVar10;
      if (uVar5 < uVar10) {
        __n = uVar5;
      }
      if (__n == 0) {
        bVar13 = true;
      }
      else {
        iVar9 = bcmp(*(void **)((long)&(peVar4->name).data_ + lVar11),name.data_,__n);
        bVar13 = iVar9 == 0;
      }
      if ((uVar5 == uVar10) && (bVar13)) {
        plVar1 = (longlong *)((long)&(peVar4->arg).value_.field_0 + lVar11);
        lVar6 = *plVar1;
        sVar7 = plVar1[1];
        puVar2 = (undefined8 *)((long)&(peVar4->arg).type_ + lVar11);
        uVar8 = puVar2[1];
        *(undefined8 *)&__return_storage_ptr__->type_ = *puVar2;
        *(undefined8 *)&__return_storage_ptr__->field_0x18 = uVar8;
        (__return_storage_ptr__->value_).field_0.long_long_value = lVar6;
        (__return_storage_ptr__->value_).field_0.string.size = sVar7;
        if (!bVar12) {
          return __return_storage_ptr__;
        }
        break;
      }
      lVar11 = lVar11 + 0x30;
      bVar12 = (ulong)uVar3 * 0x30 == lVar11;
    } while (!bVar12);
  }
  (__return_storage_ptr__->value_).field_0.int_value = 0;
  __return_storage_ptr__->type_ = none_type;
  return __return_storage_ptr__;
}

Assistant:

basic_format_arg<Context> find(basic_string_view<char_type> name) const {
    // The list is unsorted, so just return the first matching name.
    for (entry *it = map_, *end = map_ + size_; it != end; ++it) {
      if (it->name == name)
        return it->arg;
    }
    return {};
  }